

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

void __thiscall
Json::StyledStreamWriter::writeCommentBeforeValue(StyledStreamWriter *this,Value *root)

{
  _Alloc_hider _Var1;
  string local_38;
  
  if ((root->comments_ != (CommentInfo *)0x0) && (root->comments_->comment_ != (char *)0x0)) {
    if ((this->field_0x68 & 2) == 0) {
      writeIndent(this);
    }
    Value::getComment_abi_cxx11_(&local_38,root,commentBefore);
    for (_Var1._M_p = local_38._M_dataplus._M_p;
        _Var1._M_p != local_38._M_dataplus._M_p + local_38._M_string_length;
        _Var1._M_p = _Var1._M_p + 1) {
      std::operator<<(this->document_,*_Var1._M_p);
      if (((*_Var1._M_p == '\n') &&
          (_Var1._M_p != local_38._M_dataplus._M_p + local_38._M_string_length)) &&
         (_Var1._M_p[1] == '/')) {
        std::operator<<(this->document_,(string *)&this->indentString_);
      }
    }
    this->field_0x68 = this->field_0x68 & 0xfd;
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

bool Value::hasComment(CommentPlacement placement) const {
  return comments_ != 0 && comments_[placement].comment_ != 0;
}